

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O1

void __thiscall OutputContext::Print(OutputContext *this,char *str,uint length)

{
  uint uVar1;
  size_t __n;
  char *__dest;
  uint uVar2;
  
  __n = (size_t)length;
  uVar1 = this->outputBufPos;
  if (uVar1 + length < this->outputBufSize) {
    __dest = this->outputBuf + uVar1;
  }
  else {
    uVar2 = this->outputBufSize - uVar1;
    memcpy(this->outputBuf + uVar1,str,(ulong)uVar2);
    uVar1 = this->outputBufPos + uVar2;
    this->outputBufPos = uVar1;
    (*this->writeStream)(this->stream,this->outputBuf,uVar1);
    this->outputBufPos = 0;
    uVar1 = length - uVar2;
    __n = (size_t)uVar1;
    if (uVar1 == 0) {
      return;
    }
    str = str + uVar2;
    if (this->outputBufSize <= uVar1) {
      (*this->writeStream)(this->stream,str,uVar1);
      return;
    }
    __dest = this->outputBuf;
  }
  memcpy(__dest,str,__n);
  this->outputBufPos = this->outputBufPos + (int)__n;
  return;
}

Assistant:

void Print(const char *str, unsigned length)
	{
		if(outputBufPos + length < outputBufSize)
		{
			memcpy(outputBuf + outputBufPos, str, length);
			outputBufPos += length;
		}
		else
		{
			unsigned remainder = outputBufSize - outputBufPos;

			memcpy(outputBuf + outputBufPos, str, remainder);
			outputBufPos += remainder;

			writeStream(stream, outputBuf, outputBufPos);
			outputBufPos = 0;

			str += remainder;
			length -= remainder;

			if(!length)
				return;

			if(length < outputBufSize)
			{
				memcpy(outputBuf + outputBufPos, str, length);
				outputBufPos += length;
			}
			else
			{
				writeStream(stream, str, length);
			}
		}
	}